

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline(InnerProduct_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  _func_int **pp_Var6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint _w;
  Layer *pLVar11;
  undefined4 *puVar12;
  ulong uVar13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 *puVar18;
  ulong uVar19;
  uint _elempack;
  ParamDict pd;
  Mat local_78;
  
  pLVar11 = create_layer(0xe);
  this->flatten = pLVar11;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar10 = cpu_support_x86_f16c();
    if ((iVar10 == 0) || (opt->use_fp16_storage != true)) {
      p_Var2 = this->_vptr_InnerProduct_x86_avx512[-3];
      uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
      iVar10 = *(int *)(&this->field_0xd8 + (long)p_Var2);
      _w = iVar10 / (int)uVar1;
      _elempack = 1;
      if (opt->use_packing_layout == true) {
        if ((uVar1 & 0xf) == 0) {
          _elempack = 0x10;
        }
        else if ((uVar1 & 7) == 0) {
          _elempack = 8;
        }
        else {
          _elempack = (uint)((uVar1 & 3) == 0) * 3 + 1;
        }
      }
      if (_elempack == 1) {
        if (p_Var2 != (_func_int *)0xfffffffffffffee0) {
          piVar3 = *(int **)(&this->field_0x138 + (long)p_Var2);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = (this->weight_data_tm).refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = (this->weight_data_tm).data;
              pAVar5 = (this->weight_data_tm).allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])
                          (pAVar5,pvVar4,(long)iVar10 % (long)(int)uVar1 & 0xffffffff);
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          (this->weight_data_tm).c = 0;
          piVar3 = *(int **)((long)(&this->field_0x130 + (long)p_Var2) + 8);
          (this->weight_data_tm).data = *(void **)(&this->field_0x130 + (long)p_Var2);
          (this->weight_data_tm).refcount = piVar3;
          (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var2);
          (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var2);
          (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var2);
          uVar8 = *(undefined8 *)(&this->field_0x158 + (long)p_Var2);
          uVar9 = *(undefined8 *)((long)(&this->field_0x158 + (long)p_Var2) + 8);
          (this->weight_data_tm).dims = (int)uVar8;
          (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
          (this->weight_data_tm).h = (int)uVar9;
          (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
          (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var2);
          (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var2);
        }
      }
      else {
        p_Var2 = this->_vptr_InnerProduct_x86_avx512[-3];
        Mat::reshape(&local_78,(Mat *)(&this->field_0x130 + (long)p_Var2),_w,
                     *(int *)(&this->field_0xd0 + (long)p_Var2),(Allocator *)0x0);
        Mat::create(&this->weight_data_tm,_w,
                    *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
                    (int)_elempack,(ulong)(_elempack * 4),_elempack,(Allocator *)0x0);
        pp_Var6 = this->_vptr_InnerProduct_x86_avx512;
        if ((int)_elempack <= *(int *)(&this->field_0xd0 + (long)pp_Var6[-3])) {
          pvVar4 = (this->weight_data_tm).data;
          iVar10 = (this->weight_data_tm).w;
          sVar7 = (this->weight_data_tm).elemsize;
          uVar17 = (ulong)_elempack;
          uVar13 = 0;
          puVar15 = (undefined4 *)local_78.data;
          do {
            if (0 < (int)_w) {
              puVar12 = (undefined4 *)
                        (((uVar13 & 0xffffffff) / (ulong)_elempack) * (long)iVar10 * sVar7 +
                        (long)pvVar4);
              uVar16 = 0;
              puVar14 = puVar15;
              uVar19 = uVar17;
              puVar18 = puVar15;
              do {
                do {
                  *puVar12 = *puVar14;
                  puVar12 = puVar12 + 1;
                  uVar19 = uVar19 - 1;
                  puVar14 = (undefined4 *)((long)puVar14 + (long)local_78.w * local_78.elemsize);
                } while (uVar19 != 0);
                uVar16 = uVar16 + 1;
                puVar14 = puVar18 + 1;
                uVar19 = uVar17;
                puVar18 = puVar14;
              } while (uVar16 != _w);
            }
            uVar13 = uVar13 + uVar17;
            puVar15 = (undefined4 *)((long)puVar15 + (long)local_78.w * local_78.elemsize * uVar17);
          } while ((long)(uVar13 + (_elempack - 1)) <
                   (long)*(int *)(&this->field_0xd0 + (long)pp_Var6[-3]));
        }
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      if (opt->lightmode == true) {
        p_Var2 = this->_vptr_InnerProduct_x86_avx512[-3];
        piVar3 = *(int **)(&this->field_0x138 + (long)p_Var2);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (*(long **)(&this->field_0x150 + (long)p_Var2) == (long *)0x0) {
              if (*(void **)(&this->field_0x130 + (long)p_Var2) != (void *)0x0) {
                free(*(void **)(&this->field_0x130 + (long)p_Var2));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var2) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x170 + (long)p_Var2) = 0;
        *(undefined8 *)(&this->field_0x13c + (long)p_Var2) = 0;
        *(undefined8 *)(&this->field_0x144 + (long)p_Var2) = 0;
        *(undefined8 *)(&this->field_0x130 + (long)p_Var2) = 0;
        *(undefined8 *)(&this->field_0x138 + (long)p_Var2) = 0;
        *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var2) = 0;
        *(undefined4 *)(&this->field_0x168 + (long)p_Var2) = 0;
      }
    }
    else {
      create_pipeline_fp16s(this,opt);
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_tm.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_tm.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }
    else
    {
        weight_data_tm = weight_data;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}